

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

bool __thiscall CLI::Option::_has_help_positional(Option *this)

{
  bool bVar1;
  
  if ((this->pname_)._M_string_length != 0) {
    bVar1 = true;
    if ((this->requires_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
        (this->description_)._M_string_length == 0) {
      bVar1 = (this->excludes_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool get_positional() const { return pname_.length() > 0; }